

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

void __thiscall CS248::Matrix4x4::operator+=(Matrix4x4 *this,Matrix4x4 *B)

{
  double *pdVar1;
  double *pdVar2;
  double *Bij;
  double *Aij;
  Matrix4x4 *A;
  Matrix4x4 *B_local;
  Matrix4x4 *this_local;
  
  pdVar1 = &this->entries[0].y;
  this->entries[0].x = B->entries[0].x + this->entries[0].x;
  pdVar2 = &this->entries[0].z;
  *pdVar1 = B->entries[0].y + *pdVar1;
  pdVar1 = &this->entries[0].w;
  *pdVar2 = B->entries[0].z + *pdVar2;
  *pdVar1 = B->entries[0].w + *pdVar1;
  pdVar1 = &this->entries[1].y;
  this->entries[1].x = B->entries[1].x + this->entries[1].x;
  pdVar2 = &this->entries[1].z;
  *pdVar1 = B->entries[1].y + *pdVar1;
  pdVar1 = &this->entries[1].w;
  *pdVar2 = B->entries[1].z + *pdVar2;
  *pdVar1 = B->entries[1].w + *pdVar1;
  pdVar1 = &this->entries[2].y;
  this->entries[2].x = B->entries[2].x + this->entries[2].x;
  pdVar2 = &this->entries[2].z;
  *pdVar1 = B->entries[2].y + *pdVar1;
  pdVar1 = &this->entries[2].w;
  *pdVar2 = B->entries[2].z + *pdVar2;
  *pdVar1 = B->entries[2].w + *pdVar1;
  pdVar1 = &this->entries[3].y;
  this->entries[3].x = B->entries[3].x + this->entries[3].x;
  pdVar2 = &this->entries[3].z;
  *pdVar1 = B->entries[3].y + *pdVar1;
  pdVar1 = &this->entries[3].w;
  *pdVar2 = B->entries[3].z + *pdVar2;
  *pdVar1 = B->entries[3].w + *pdVar1;
  return;
}

Assistant:

void Matrix4x4::operator+=( const Matrix4x4& B ) {

    Matrix4x4& A( *this );
    double* Aij = (double*) &A;
    const double* Bij = (const double*) &B;

	// Add the 16 contigous vector packed double values.
    *Aij++ += *Bij++;//0
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;//4
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;//8
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;//12
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;//15
	//16.

  }